

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O1

void append_to_file(ang_file *fff)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  equippable_summary *peVar3;
  wchar_t wVar4;
  char *p;
  wchar_t wVar5;
  equippable_summary **in_RSI;
  char *pcVar6;
  char *pcVar7;
  wchar_t wVar8;
  wchar_t wid;
  wchar_t c;
  wchar_t a;
  wchar_t hgt;
  wchar_t local_54;
  wchar_t local_50;
  wchar_t local_4c;
  wchar_t local_48;
  int local_44;
  ang_file *local_40;
  int local_34;
  
  local_40 = fff;
  if (s_for_file == (equippable_summary *)0x0) {
    wVar5 = initialize_summary(player,in_RSI);
    if (wVar5 != L'\0') {
      return;
    }
    s_for_file = the_summary;
  }
  peVar3 = s_for_file;
  wVar5 = L'\0';
  if ((s_for_file->indinc < L'\x01') &&
     (wVar5 = s_for_file->nfilt + L'\xffffffff', s_for_file->nfilt == L'\0')) {
    wVar5 = L'\0';
  }
  local_48 = s_for_file->ifirst;
  local_4c = s_for_file->npage;
  s_for_file->ifirst = wVar5;
  wVar5 = peVar3->nfilt;
  if (peVar3->maxpage < peVar3->nfilt) {
    wVar5 = peVar3->maxpage;
  }
  peVar3->npage = wVar5;
  Term_get_size(&local_54,&local_34);
  wVar5 = text_wcsz();
  p = (char *)mem_alloc((long)wVar5 * (long)local_54 + 1);
  display_page(s_for_file,player,false);
  wVar5 = s_for_file->irow_combined_equip - s_for_file->nproplab;
  if (wVar5 < s_for_file->npage + s_for_file->irow_combined_equip + L'\x01') {
    do {
      pcVar6 = p;
      if (L'\0' < local_54) {
        wVar8 = L'\0';
        do {
          Term_what(wVar8,wVar5,&local_44,&local_50);
          wVar4 = text_wctomb(pcVar6,local_50);
          if (wVar4 < L'\x01') {
            *pcVar6 = ' ';
            pcVar6 = pcVar6 + 1;
          }
          else {
            pcVar6 = pcVar6 + (uint)wVar4;
          }
          wVar8 = wVar8 + L'\x01';
        } while (wVar8 < local_54);
      }
      do {
        pcVar7 = pcVar6;
        if (pcVar7 <= p) break;
        pcVar6 = pcVar7 + -1;
      } while (pcVar7[-1] == ' ');
      *pcVar7 = '\0';
      file_putf(local_40,"%s\n",p);
      wVar5 = wVar5 + L'\x01';
    } while (wVar5 < s_for_file->irow_combined_equip + s_for_file->npage + L'\x01');
  }
  do {
    peVar3 = s_for_file;
    pwVar1 = &s_for_file->indinc;
    wVar5 = s_for_file->npage;
    wVar8 = *pwVar1 * wVar5 + s_for_file->ifirst;
    s_for_file->ifirst = wVar8;
    if (*pwVar1 < L'\x01') {
      if (wVar8 < L'\0') goto LAB_001cdd33;
      if (wVar8 - wVar5 < -1) {
        wVar4 = wVar8 + L'\x01';
        goto LAB_001cdc70;
      }
    }
    else {
      wVar2 = peVar3->nfilt;
      wVar4 = wVar2 - wVar8;
      if (wVar4 == L'\0' || wVar2 < wVar8) {
LAB_001cdd33:
        mem_free(p);
        s_for_file->ifirst = local_48;
        s_for_file->npage = local_4c;
        s_for_file = (equippable_summary *)0x0;
        return;
      }
      if (wVar2 < wVar8 + wVar5) {
LAB_001cdc70:
        peVar3->npage = wVar4;
      }
    }
    display_page(peVar3,player,false);
    wVar8 = s_for_file->irow_combined_equip + L'\x01';
    wVar5 = s_for_file->npage + wVar8;
    for (; wVar8 < wVar5; wVar8 = wVar8 + L'\x01') {
      pcVar6 = p;
      if (L'\0' < local_54) {
        wVar5 = L'\0';
        do {
          Term_what(wVar5,wVar8,&local_44,&local_50);
          wVar4 = text_wctomb(pcVar6,local_50);
          if (wVar4 < L'\x01') {
            *pcVar6 = ' ';
            pcVar6 = pcVar6 + 1;
          }
          else {
            pcVar6 = pcVar6 + (uint)wVar4;
          }
          wVar5 = wVar5 + L'\x01';
        } while (wVar5 < local_54);
      }
      do {
        pcVar7 = pcVar6;
        if (pcVar7 <= p) break;
        pcVar6 = pcVar7 + -1;
      } while (pcVar7[-1] == ' ');
      *pcVar7 = '\0';
      file_putf(local_40,"%s\n",p);
      wVar5 = s_for_file->irow_combined_equip + s_for_file->npage + L'\x01';
    }
  } while( true );
}

Assistant:

static void append_to_file(ang_file *fff)
{
	int cached_ifirst, cached_npage;
	int wid, hgt, y;
	char *buf;

	if (!s_for_file) {
		if (initialize_summary(player, &the_summary)) {
			return;
		}
		s_for_file = the_summary;
	}

	cached_ifirst = s_for_file->ifirst;
	cached_npage = s_for_file->npage;
	s_for_file->ifirst =
		(s_for_file->indinc > 0 || s_for_file->nfilt == 0) ?
		0 : s_for_file->nfilt - 1;
	s_for_file->npage =
		(s_for_file->maxpage <= s_for_file->nfilt) ?
		s_for_file->maxpage : s_for_file->nfilt;

	Term_get_size(&wid, &hgt);
	buf = mem_alloc(text_wcsz() * wid + 1);

	(void) display_page(s_for_file, player, false);

	/* Dump part of the screen. */
	for (y = s_for_file->irow_combined_equip - s_for_file->nproplab;
		y < s_for_file->irow_combined_equip + 1 + s_for_file->npage;
		++y) {
		char *p = buf;
		int x, a, n;
		wchar_t c;

		/* Dump a row. */
		for (x = 0; x < wid; ++x) {
			(void) Term_what(x, y, &a, &c);
			n = text_wctomb(p, c);
			if (n > 0) {
				p += n;
			} else {
				*p++ = ' ';
			}
		}
		/* Back up over spaces */
		while ((p > buf) && (p[-1] == ' ')) {
			--p;
		}
		/* Terminate */
		*p = '\0';

		file_putf(fff, "%s\n", buf);
	}

	while (1) {
		s_for_file->ifirst += s_for_file->npage * s_for_file->indinc;
		if (s_for_file->indinc > 0) {
			if (s_for_file->ifirst >= s_for_file->nfilt) {
				break;
			}
			if (s_for_file->ifirst + s_for_file->npage >
				s_for_file->nfilt) {
				s_for_file->npage = s_for_file->nfilt -
					s_for_file->ifirst;
			}
		} else {
			if (s_for_file->ifirst < 0) {
				break;
			}
			if (s_for_file->ifirst - s_for_file->npage < -1) {
				s_for_file->npage = s_for_file->ifirst + 1;
			}
		}

		(void) display_page(s_for_file, player, false);

		/*
		 * Dump part of the screen.  Exclude the header that appeared
		 * on the first page.
		 */
		for (y = s_for_file->irow_combined_equip + 1;
			y < s_for_file->irow_combined_equip + 1 +
			s_for_file->npage; ++y) {
			char *p = buf;
			int x, a, n;
			wchar_t c;

			/* Dump a row. */
			for (x = 0; x < wid; ++x) {
				(void) Term_what(x, y, &a, &c);
				n = text_wctomb(p, c);
				if (n > 0) {
					p += n;
				} else {
					*p++ = ' ';
				}
			}
			/* Back up over spaces */
			while ((p > buf) && (p[-1] == ' ')) {
				--p;
			}
			/* Terminate */
			*p = '\0';

			file_putf(fff, "%s\n", buf);
		}
	}

	mem_free(buf);

	s_for_file->ifirst = cached_ifirst;
	s_for_file->npage = cached_npage;
	s_for_file = NULL;
}